

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void dump_fx(frameex1 *fx_addr68k)

{
  DLword *NAddr;
  ushort uVar1;
  LispPTR LVar2;
  uint uVar3;
  frameex1 *NAddr_00;
  char *__format;
  undefined1 *puVar4;
  DLword *pDVar5;
  
  if ((*(ushort *)&fx_addr68k->field_0x2 & 0xe000) == 0xc000) {
    puVar4 = &fx_addr68k->field_0x2;
    LVar2 = get_framename(fx_addr68k);
    printf("\n*** Frame Extension for ");
    print(LVar2);
    LVar2 = LAddrFromNative(fx_addr68k);
    printf("\n %x : %x %x ",(ulong)LVar2,(ulong)*(ushort *)((ulong)fx_addr68k ^ 2),
           (ulong)*(ushort *)((ulong)puVar4 ^ 2));
    putchar(0x5b);
    uVar1 = *(ushort *)&fx_addr68k->field_0x2;
    if ((uVar1 >> 0xc & 1) != 0) {
      printf("F,");
      uVar1 = *(ushort *)puVar4;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      printf("incall, ");
      uVar1 = *(ushort *)puVar4;
    }
    uVar3 = (uint)uVar1;
    if ((uVar1 >> 9 & 1) != 0) {
      printf("V, ");
      uVar3 = (uint)(byte)*puVar4;
    }
    printf("usecnt = %d]; alink",(ulong)(uVar3 & 0xff));
    if ((fx_addr68k->alink & 1) != 0) {
      printf("[SLOWP]");
    }
    LVar2 = LAddrFromNative(&fx_addr68k->fnheader);
    printf("\n %x : %x %x fnheadlo, fnheadhi\n",(ulong)LVar2,
           (ulong)*(ushort *)((ulong)&fx_addr68k->fnheader ^ 2),
           (ulong)*(ushort *)((ulong)((long)&fx_addr68k->fnheader + 2U) ^ 2));
    LVar2 = LAddrFromNative(&fx_addr68k->pc);
    printf("\n %x : %x %x next,     pc\n",(ulong)LVar2,
           (ulong)*(ushort *)((ulong)&fx_addr68k->pc ^ 2),
           (ulong)*(ushort *)((ulong)&fx_addr68k->nextblock ^ 2));
    LVar2 = LAddrFromNative(&fx_addr68k->nametable);
    printf("\n %x : %x %x LoNmTbl,  HiNmTbl\n",(ulong)LVar2,
           (ulong)*(ushort *)((ulong)&fx_addr68k->nametable ^ 2),
           (ulong)*(ushort *)((ulong)((long)&fx_addr68k->nametable + 2U) ^ 2));
    NAddr = &fx_addr68k->clink;
    LVar2 = LAddrFromNative(NAddr);
    printf("\n %x : %x %x #blink,   #clink\n",(ulong)LVar2,(ulong)*(ushort *)((ulong)NAddr ^ 2),
           (ulong)*(ushort *)((ulong)&fx_addr68k->blink ^ 2));
    pDVar5 = MachineState.csp + 2;
    if ((frameex1 *)(MachineState.pvar + -10) != fx_addr68k) {
      pDVar5 = (DLword *)((ulong)((uint)fx_addr68k->nextblock * 2) + (long)Stackspace);
    }
    if (((ulong)pDVar5 & 1) == 0 && NAddr <= pDVar5) {
      puVar4 = &fx_addr68k[1].field_0x2;
      for (NAddr_00 = fx_addr68k + 1; &NAddr_00[-1].clink < pDVar5;
          NAddr_00 = (frameex1 *)&NAddr_00->fnheader) {
        LVar2 = LAddrFromNative(NAddr_00);
        printf("\n %x : %x %x",(ulong)LVar2,(ulong)*(ushort *)((ulong)(puVar4 + -2) ^ 2),
               (ulong)*(ushort *)((ulong)puVar4 ^ 2));
        puVar4 = puVar4 + 4;
      }
      return;
    }
    __format = "\nNext block invalid";
  }
  else {
    __format = "\nInvalid frame,NOT FX";
  }
  printf(__format);
  return;
}

Assistant:

void dump_fx(struct frameex1 *fx_addr68k) {
  DLword *next68k;
  DLword *ptr;
  LispPTR atomindex;

  ptr = (DLword *)fx_addr68k;

  if (fx_addr68k->flags != 6) {
    printf("\nInvalid frame,NOT FX");
    return;
  }

  atomindex = get_framename((struct frameex1 *)fx_addr68k);
  printf("\n*** Frame Extension for ");
  print(atomindex);
  printf("\n %x : %x %x ", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  putchar('[');
  if (fx_addr68k->fast) printf("F,");
  if (fx_addr68k->incall) printf("incall, ");
  if (fx_addr68k->validnametable) printf("V, ");
  printf("usecnt = %d]; alink", fx_addr68k->usecount);
  if (fx_addr68k->alink & 1) printf("[SLOWP]");

  ptr += 2;
  printf("\n %x : %x %x fnheadlo, fnheadhi\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x next,     pc\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x LoNmTbl,  HiNmTbl\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x #blink,   #clink\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  /* should pay attention to the name table like RAID does */

  next68k = NativeAligned2FromStackOffset(fx_addr68k->nextblock);
  if (fx_addr68k == CURRENTFX) { next68k = CurrentStackPTR + 2; }

  if ((next68k < ptr) || (((UNSIGNED)next68k & 1) != 0)) {
    printf("\nNext block invalid");
    return;
  }

  while (next68k > ptr) {
    ptr += 2;
    printf("\n %x : %x %x", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));
  }
}